

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::KeyValue::read(KeyValue *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  undefined8 *puVar6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  uint local_70;
  TType ftype;
  KeyValue *local_68;
  string *local_60;
  string *local_58;
  string fname;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&fname);
  local_58 = &this->value;
  local_60 = &this->key;
  local_70 = 0;
  local_68 = this;
  do {
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&fname,&ftype,&fid);
    if (ftype == T_STOP) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if ((local_70 & 1) != 0) {
        std::__cxx11::string::~string((string *)&fname);
        this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar3 + iVar2 + iVar1);
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar6[1] = puVar6 + 3;
      puVar6[2] = 0;
      *(undefined1 *)(puVar6 + 3) = 0;
      *puVar6 = &PTR__TException_004da448;
      *(undefined4 *)(puVar6 + 5) = 1;
      __cxa_throw(puVar6,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                  duckdb_apache::thrift::TException::~TException);
    }
    if (fid == 2) {
      pp_Var5 = this_00->_vptr_TProtocol;
      if (ftype != T_STRING) goto LAB_003114cd;
      iVar3 = (*pp_Var5[0x2a])(this_00,local_58);
      local_68->__isset = (_KeyValue__isset)((byte)local_68->__isset | 1);
    }
    else {
      if (fid == 1) {
        pp_Var5 = this_00->_vptr_TProtocol;
        if (ftype == T_STRING) {
          iVar3 = (*pp_Var5[0x2a])(this_00,local_60);
          local_70 = (uint)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
          goto LAB_003114d9;
        }
      }
      else {
        pp_Var5 = this_00->_vptr_TProtocol;
      }
LAB_003114cd:
      iVar3 = (*pp_Var5[0x2c])(this_00);
    }
LAB_003114d9:
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t KeyValue::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_key = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->key);
          isset_key = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->value);
          this->__isset.value = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_key)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}